

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::VersionSet::AddLiveFiles
          (VersionSet *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *live)

{
  long lVar1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar2;
  value_type_conflict5 *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  int level;
  Version *v;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffff98;
  value_type_conflict5 *__x;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_48;
  int local_34;
  long local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_30 = *(long *)(in_RDI + 0x88); local_30 != in_RDI + 0x80;
      local_30 = *(long *)(local_30 + 8)) {
    for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
      local_48 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)0x0
      ;
      while( true ) {
        this_00 = local_48;
        psVar2 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                 size(in_stack_ffffffffffffff98);
        if (psVar2 <= this_00) break;
        __x = in_RSI;
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   this_00,(size_type)in_RSI);
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                  (this_00,__x);
        local_48 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &(local_48->_M_t)._M_impl.field_0x1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VersionSet::AddLiveFiles(std::set<uint64_t>* live) {
  for (Version* v = dummy_versions_.next_; v != &dummy_versions_;
       v = v->next_) {
    for (int level = 0; level < config::kNumLevels; level++) {
      const std::vector<FileMetaData*>& files = v->files_[level];
      for (size_t i = 0; i < files.size(); i++) {
        live->insert(files[i]->number);
      }
    }
  }
}